

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilerOutputter.cpp
# Opt level: O2

void __thiscall CppUnit::CompilerOutputter::printStatistics(CompilerOutputter *this)

{
  int iVar1;
  ostream *poVar2;
  
  std::operator<<(this->m_stream,"Failures !!!\n");
  poVar2 = std::operator<<(this->m_stream,"Run: ");
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xb])
                    ();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"   ");
  poVar2 = std::operator<<(poVar2,"Failure total: ");
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xe])
                    ();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"   ");
  poVar2 = std::operator<<(poVar2,"Failures: ");
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xd])
                    ();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"   ");
  poVar2 = std::operator<<(poVar2,"Errors: ");
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xc])
                    ();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void 
CompilerOutputter::printStatistics()
{
  m_stream  <<  "Failures !!!\n";
  m_stream  <<  "Run: "  <<  m_result->runTests()  << "   "
            <<  "Failure total: "  <<  m_result->testFailuresTotal()  << "   "
            <<  "Failures: "  <<  m_result->testFailures()  << "   "
            <<  "Errors: "  <<  m_result->testErrors()
            <<  "\n";
}